

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystementry.cpp
# Opt level: O0

QString * __thiscall QFileSystemEntry::path(QFileSystemEntry *this)

{
  long lVar1;
  QChar QVar2;
  QString *in_RSI;
  QFileSystemEntry *in_RDI;
  long in_FS_OFFSET;
  QString *n;
  QFileSystemEntry *this_00;
  QChar local_c;
  QChar local_a [4];
  QChar QVar3;
  
  unique0x00012000 = *(long *)(in_FS_OFFSET + 0x28);
  n = in_RSI;
  this_00 = in_RDI;
  findLastSeparator(in_RDI);
  if (*(short *)&in_RSI[2].d.d == -1) {
    QChar::QChar<char16_t,_true>(local_a,L'.');
    lVar1 = stack0xfffffffffffffff8;
    QVar3.ucs = (char16_t)((ulong)stack0xfffffffffffffff8 >> 0x30);
    QVar2.ucs = QVar3.ucs;
    unique0x1000014c = lVar1;
    QString::QString(in_RSI,QVar2);
  }
  else if (*(short *)&in_RSI[2].d.d == 0) {
    QChar::QChar<char16_t,_true>(&local_c,L'/');
    lVar1 = stack0xfffffffffffffff8;
    QVar3.ucs = (char16_t)((ulong)stack0xfffffffffffffff8 >> 0x30);
    QVar2.ucs = QVar3.ucs;
    unique0x10000144 = lVar1;
    QString::QString(in_RSI,QVar2);
  }
  else {
    QString::left(&this_00->m_filePath,(qsizetype)n);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == stack0xfffffffffffffff8) {
    return &in_RDI->m_filePath;
  }
  __stack_chk_fail();
}

Assistant:

QString QFileSystemEntry::path() const
{
    findLastSeparator();
    if (m_lastSeparator == -1) {
#if defined(Q_OS_WIN)
        if (m_filePath.length() >= 2 && m_filePath.at(1) == u':')
            return m_filePath.left(2);
#endif
        return QString(u'.');
    }
    if (m_lastSeparator == 0)
        return QString(u'/');
#if defined(Q_OS_WIN)
    if (m_lastSeparator == 2 && m_filePath.at(1) == u':')
        return m_filePath.left(m_lastSeparator + 1);
#endif
    return m_filePath.left(m_lastSeparator);
}